

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_aux.c
# Opt level: O0

int panic(lua_State *L)

{
  char *local_20;
  char *s;
  lua_State *L_local;
  
  local_20 = lua_tolstring(L,-1,(size_t *)0x0);
  fputs("PANIC: unprotected error in call to Lua API (",_stderr);
  if (local_20 == (char *)0x0) {
    local_20 = "?";
  }
  fputs(local_20,_stderr);
  fputc(0x29,_stderr);
  fputc(10,_stderr);
  fflush(_stderr);
  return 0;
}

Assistant:

static int panic(lua_State *L)
{
  const char *s = lua_tostring(L, -1);
  fputs("PANIC: unprotected error in call to Lua API (", stderr);
  fputs(s ? s : "?", stderr);
  fputc(')', stderr); fputc('\n', stderr);
  fflush(stderr);
  return 0;
}